

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<std::complex<float>,_10>::Shrink(TPZManVector<std::complex<float>,_10> *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  long in_RDI;
  int64_t i_1;
  complex<float> *newstore;
  int64_t i;
  complex<float> *local_60;
  long local_30;
  complex<float> *local_18;
  long local_10;
  
  if (*(long *)(in_RDI + 0x10) < 0xb) {
    if (*(long *)(in_RDI + 8) != in_RDI + 0x20) {
      for (local_10 = 0; local_10 < *(long *)(in_RDI + 0x10); local_10 = local_10 + 1) {
        *(undefined8 *)(in_RDI + 0x20 + local_10 * 8) =
             *(undefined8 *)(*(long *)(in_RDI + 8) + local_10 * 8);
      }
      if ((*(long *)(in_RDI + 8) != 0) && (*(void **)(in_RDI + 8) != (void *)0x0)) {
        operator_delete__(*(void **)(in_RDI + 8));
      }
      *(long *)(in_RDI + 8) = in_RDI + 0x20;
      *(undefined8 *)(in_RDI + 0x18) = 10;
    }
  }
  else if (*(long *)(in_RDI + 0x18) != *(long *)(in_RDI + 0x10)) {
    local_18 = (complex<float> *)0x0;
    if (*(long *)(in_RDI + 0x10) != 0) {
      uVar1 = *(ulong *)(in_RDI + 0x10);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar1;
      uVar3 = SUB168(auVar2 * ZEXT816(8),0);
      if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      local_18 = (complex<float> *)operator_new__(uVar3);
      if (uVar1 != 0) {
        local_60 = local_18;
        do {
          std::complex<float>::complex(local_60,0.0,0.0);
          local_60 = local_60 + 1;
        } while (local_60 != local_18 + uVar1);
      }
    }
    for (local_30 = 0; local_30 < *(long *)(in_RDI + 0x10); local_30 = local_30 + 1) {
      local_18[local_30]._M_value = *(_ComplexT *)(*(long *)(in_RDI + 8) + local_30 * 8);
    }
    if ((*(long *)(in_RDI + 8) != 0) && (*(void **)(in_RDI + 8) != (void *)0x0)) {
      operator_delete__(*(void **)(in_RDI + 8));
    }
    *(complex<float> **)(in_RDI + 8) = local_18;
    *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RDI + 0x10);
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Shrink() {
    // Philippe : Porque NumExtAlloc <= this->fNAlloc????
    //    if(this->fNElements <= NumExtAlloc && NumExtAlloc <= this->fNAlloc) {
    if (this->fNElements <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0; i < this->fNElements; i++)
                fExtAlloc[i] = this->fStore[i];

            if (this->fStore)
                delete [] this->fStore;

            this->fStore = fExtAlloc;
            this->fNAlloc = NumExtAlloc;
        }
    } else if (this->fNAlloc != this->fNElements) { // then  fExtAlloc != this->fStore  because  NumExtAlloc != this->fNAlloc
        // Philippe : Memoria alocada externamente nao pode ser deletada
        //          if(fExtAlloc) delete[] fExtAlloc;
        T *newstore = 0;

        if (this->fNElements)
            newstore = new T[this->fNElements];

        for (int64_t i = 0; i < this->fNElements; i++)
            newstore[i] = this->fStore[i];

        if (this->fStore)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNAlloc = this->fNElements;

        // Philippe Isto eh um absurdo
        //          fExtAlloc = this->fStore;
        //          NumExtAlloc = this->fNAlloc;
    }
}